

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Saig_BmcInterval(Saig_Bmc_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pNode;
  int nNodes;
  int iFrame;
  int iObj;
  int i;
  Aig_Obj_t *pTarget;
  Saig_Bmc_t *p_local;
  
  iVar1 = Aig_ManObjNum(p->pFrm);
  Vec_PtrClear(p->vTargets);
  p->iFramePrev = p->iFrameLast;
  do {
    if (p->nFramesMax <= p->iFrameLast) {
      return;
    }
    if (p->iOutputLast == 0) {
      pAVar4 = Aig_ManConst1(p->pAig);
      iVar3 = p->iFrameLast;
      pNode = Aig_ManConst1(p->pFrm);
      Saig_BmcObjSetFrame(p,pAVar4,iVar3,pNode);
    }
    while (iVar3 = p->iOutputLast, iVar2 = Saig_ManPoNum(p->pAig), iVar3 < iVar2) {
      iVar3 = Aig_ManObjNum(p->pFrm);
      if (iVar1 + p->nNodesMax <= iVar3) {
        return;
      }
      Vec_IntClear(p->vVisited);
      pAVar4 = Aig_ManCo(p->pAig,p->iOutputLast);
      pAVar4 = Saig_BmcIntervalConstruct_rec(p,pAVar4,p->iFrameLast,p->vVisited);
      Vec_PtrPush(p->vTargets,pAVar4);
      Aig_ObjCreateCo(p->pFrm,pAVar4);
      Aig_ManCleanup(p->pFrm);
      for (iFrame = 0; iVar3 = Vec_IntSize(p->vVisited), iFrame + 1 < iVar3; iFrame = iFrame + 2) {
        iVar3 = Vec_IntEntry(p->vVisited,iFrame);
        iVar2 = Vec_IntEntry(p->vVisited,iFrame + 1);
        pAVar4 = Aig_ManObj(p->pAig,iVar3);
        Saig_BmcObjFrame(p,pAVar4,iVar2);
      }
      p->iOutputLast = p->iOutputLast + 1;
    }
    p->iFrameLast = p->iFrameLast + 1;
    p->iOutputLast = 0;
  } while( true );
}

Assistant:

void Saig_BmcInterval( Saig_Bmc_t * p )
{
    Aig_Obj_t * pTarget;
    int i, iObj, iFrame;
    int nNodes = Aig_ManObjNum( p->pFrm );
    Vec_PtrClear( p->vTargets );
    p->iFramePrev = p->iFrameLast;
    for ( ; p->iFrameLast < p->nFramesMax; p->iFrameLast++, p->iOutputLast = 0 )
    { 
        if ( p->iOutputLast == 0 )
        {
            Saig_BmcObjSetFrame( p, Aig_ManConst1(p->pAig), p->iFrameLast, Aig_ManConst1(p->pFrm) );
        }
        for ( ; p->iOutputLast < Saig_ManPoNum(p->pAig); p->iOutputLast++ )
        {
            if ( Aig_ManObjNum(p->pFrm) >= nNodes + p->nNodesMax )
                return;
//            Saig_BmcIntervalExplore_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast );
            Vec_IntClear( p->vVisited );
            pTarget = Saig_BmcIntervalConstruct_rec( p, Aig_ManCo(p->pAig, p->iOutputLast), p->iFrameLast, p->vVisited );
            Vec_PtrPush( p->vTargets, pTarget );
            Aig_ObjCreateCo( p->pFrm, pTarget );
            Aig_ManCleanup( p->pFrm ); // it is not efficient to cleanup the whole manager!!!
            // check if the node is gone
            Vec_IntForEachEntryDouble( p->vVisited, iObj, iFrame, i )
                Saig_BmcObjFrame( p, Aig_ManObj(p->pAig, iObj), iFrame );
            // it is not efficient to remove nodes, which may be used later!!!
        }
    }
}